

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O1

ostream * glu::detail::operator<<(ostream *str,BooleanPointerFmt *fmt)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  Enum<int,_1UL> local_40;
  
  if (*(long *)fmt == 0) {
    pcVar2 = "(null)";
    lVar1 = 6;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
    if (*(int *)(fmt + 8) != 0) {
      uVar3 = 0;
      do {
        if (uVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
        }
        local_40.m_getName = getBooleanName;
        local_40.m_value = (int)*(byte *)(*(long *)fmt + uVar3);
        tcu::Format::Enum<int,_1UL>::toStream(&local_40,str);
        uVar3 = uVar3 + 1;
      } while (uVar3 < *(uint *)(fmt + 8));
    }
    pcVar2 = " }";
    lVar1 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(str,pcVar2,lVar1);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const BooleanPointerFmt& fmt)
{
	if (fmt.value)
	{
		str << "{ ";
		for (deUint32 ndx = 0; ndx < fmt.size; ndx++)
		{
			if (ndx != 0)
				str << ", ";
			str << getBooleanStr(fmt.value[ndx]);
		}
		str << " }";
		return str;
	}
	else
		return str << "(null)";
}